

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::Expression::bindLookupResult
          (Expression *this,Compilation *comp,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  MemberSelector *selector;
  SourceLocation SVar1;
  AssertionInstanceExpression *pAVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  SourceRange range;
  bool bVar7;
  ExpressionKind EVar8;
  Type *args;
  Expression *pEVar9;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *ppEVar10;
  InvocationExpressionSyntax *pIVar11;
  ulong uVar12;
  SourceLocation SVar13;
  AssertionInstanceExpression *this_00;
  long lVar14;
  SourceRange sourceRange_00;
  SourceRange range_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  SourceRange sourceRange_03;
  undefined1 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd21;
  ASTContext *in_stack_fffffffffffffd28;
  InvocationExpressionSyntax *invocation_local;
  SourceRange sourceRange_local;
  ArrayOrRandomizeMethodExpressionSyntax *withClause_local;
  SourceRange local_2a8;
  anon_class_32_4_8f84bd9b errorIfInvoke;
  HierarchicalReference hierRef;
  undefined1 local_248 [192];
  Element *local_188;
  BumpAllocator *local_180;
  FreeNode *local_178;
  Element local_170 [2];
  Diagnostic *local_130;
  Type *local_128;
  Type *local_120;
  Diagnostic local_118 [2];
  
  SVar13 = sourceRange.endLoc;
  sourceRange_local.endLoc = sourceRange.startLoc;
  this_00 = (AssertionInstanceExpression *)(comp->super_BumpAllocator).head;
  invocation_local = (InvocationExpressionSyntax *)SVar13;
  sourceRange_local.startLoc = (SourceLocation)result;
  withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)invocation;
  if (this_00 == (AssertionInstanceExpression *)0x0) {
    pEVar9 = badExpr((Compilation *)this,(Expression *)0x0);
    return pEVar9;
  }
  errorIfInvoke.invocation = &invocation_local;
  errorIfInvoke.sourceRange = &sourceRange_local;
  errorIfInvoke.context = (ASTContext *)withClause;
  errorIfInvoke.withClause = &withClause_local;
  if ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 4) != 0) &&
     (bVar7 = Symbol::isType((Symbol *)this_00), bVar7)) {
    sourceRange_02.endLoc = (SourceLocation)withClause;
    sourceRange_02.startLoc = sourceRange_local.endLoc;
    args = Type::fromLookupResult
                     ((Type *)this,comp,(LookupResult *)sourceRange_local.startLoc,sourceRange_02,
                      (ASTContext *)invocation);
    pEVar9 = &BumpAllocator::
              emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                        ((BumpAllocator *)this,args,&sourceRange_local)->super_Expression;
    bVar7 = bad(pEVar9);
    if (bVar7) {
      return pEVar9;
    }
    bVar7 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()(&errorIfInvoke);
    if (bVar7) {
      return pEVar9;
    }
    goto LAB_003592f7;
  }
  pIVar11 = invocation_local;
  EVar8 = (this_00->super_Expression).kind;
  if (EVar8 == (Dist|StructuredAssignmentPattern)) {
    lVar14._0_4_ = (comp->options).maxConstexprDepth;
    lVar14._4_4_ = (comp->options).maxConstexprSteps;
    if (((((lVar14 == 0) && (((ulong)this_00[3].super_Expression.syntax & 0x200000000) != 0)) &&
         (SVar1 = (this_00->super_Expression).sourceRange.startLoc, SVar1 != (SourceLocation)0x0))
        && ((invocation_local != (InvocationExpressionSyntax *)0x0 ||
            ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 0x100) !=
              0 && (((ulong)this->constant & 0x200) != 0)))))) &&
       (pAVar2 = *(AssertionInstanceExpression **)((long)SVar1 + 8),
       (pAVar2->super_Expression).kind == 0x40)) {
      if (*(AssertionInstanceExpression **)&pAVar2[2].super_Expression == this_00) {
        this_00 = pAVar2;
      }
      EVar8 = (this_00->super_Expression).kind;
      goto LAB_00359029;
    }
LAB_003591ae:
    bVar7 = false;
    if ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 0x100000) != 0)
       && (lVar4._0_4_ = (comp->options).maxConstexprDepth,
          lVar4._4_4_ = (comp->options).maxConstexprSteps, lVar4 != 0)) {
      lVar14 = *(long *)&(comp->options).maxCheckerInstanceDepth;
      if (lVar14 == 0) {
        bVar7 = false;
      }
      else {
        bVar7 = *(char *)(lVar14 + 0x28) == '\x01';
      }
    }
    HierarchicalReference::fromLookup(&hierRef,(Compilation *)this,(LookupResult *)comp);
    SVar13 = (SourceLocation)0x0;
LAB_00359203:
    sourceRange_01.endLoc = SVar13;
    sourceRange_01.startLoc = sourceRange_local.endLoc;
    pEVar9 = ValueExpressionBase::fromSymbol
                       ((ValueExpressionBase *)withClause,(ASTContext *)this_00,(Symbol *)&hierRef,
                        (HierarchicalReference *)sourceRange_local.startLoc,sourceRange_01,bVar7,
                        (bool)in_stack_fffffffffffffd20);
  }
  else {
LAB_00359029:
    if ((EVar8 - 0x4f < 2) || (EVar8 == 0x55)) {
      lVar6._0_4_ = (comp->options).maxConstexprDepth;
      lVar6._4_4_ = (comp->options).maxConstexprSteps;
      if (lVar6 == 0) {
        invocation_local = (InvocationExpressionSyntax *)0x0;
      }
      else {
        pIVar11 = (InvocationExpressionSyntax *)0x0;
      }
      range.endLoc = (SourceLocation)withClause;
      range.startLoc = sourceRange_local.endLoc;
      pEVar9 = AssertionInstanceExpression::fromLookup
                         (this_00,(Symbol *)pIVar11,
                          (InvocationExpressionSyntax *)sourceRange_local.startLoc,range,
                          (ASTContext *)invocation);
      if (((this_00->super_Expression).kind == 0x55) &&
         (((comp->options).maxInstanceDepth & 2) != 0)) {
        if (pIVar11 == (InvocationExpressionSyntax *)0x0) {
          sourceRange_00.endLoc = sourceRange_local.endLoc;
          sourceRange_00.startLoc = sourceRange_local.startLoc;
        }
        else {
          sourceRange_00 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pIVar11);
        }
        ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x690007,sourceRange_00);
      }
    }
    else {
      if (EVar8 == 0x48) {
        lVar3._0_4_ = (comp->options).maxConstexprDepth;
        lVar3._4_4_ = (comp->options).maxConstexprSteps;
        SVar13._1_7_ = 0;
        SVar13._0_1_ = lVar3 != 0;
        HierarchicalReference::fromLookup(&hierRef,(Compilation *)this,(LookupResult *)comp);
        bVar7 = false;
        goto LAB_00359203;
      }
      if (EVar8 == 0x51) {
        range_00.endLoc = (SourceLocation)withClause;
        range_00.startLoc = sourceRange_local.endLoc;
        pEVar9 = AssertionInstanceExpression::bindPort
                           (this_00,(Symbol *)sourceRange_local.startLoc,range_00,
                            (ASTContext *)SVar13);
      }
      else {
        if (EVar8 != 0x40) goto LAB_003591ae;
        if (invocation_local == (InvocationExpressionSyntax *)0x0) {
          local_2a8.endLoc = sourceRange_local.endLoc;
          local_2a8.startLoc = sourceRange_local.startLoc;
          pIVar11 = (InvocationExpressionSyntax *)0x0;
        }
        else {
          local_2a8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)invocation_local);
          pIVar11 = invocation_local;
        }
        local_248[0] = 0;
        in_stack_fffffffffffffd20 = local_2a8.endLoc._0_1_;
        in_stack_fffffffffffffd21 = local_2a8.endLoc._1_7_;
        hierRef.target = (Symbol *)this_00;
        pEVar9 = CallExpression::fromLookup
                           ((CallExpression *)this,(Compilation *)&hierRef,(Subroutine *)0x0,
                            (Expression *)pIVar11,(InvocationExpressionSyntax *)withClause_local,
                            withClause,local_2a8,in_stack_fffffffffffffd28);
        invocation_local = (InvocationExpressionSyntax *)0x0;
        withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)0x0;
      }
    }
  }
  lVar14 = 0;
  for (uVar12 = 0; uVar5._0_4_ = (comp->options).maxConstexprDepth,
      uVar5._4_4_ = (comp->options).maxConstexprSteps, uVar12 < uVar5; uVar12 = uVar12 + 1) {
    lVar6 = *(long *)&(comp->options).maxCheckerInstanceDepth;
    selector = (MemberSelector *)(lVar6 + lVar14);
    if ((lVar6 == 0) || (*(char *)(lVar6 + 0x28 + lVar14) != '\x01')) {
      ppEVar10 = std::
                 get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                           ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             *)selector);
      pEVar9 = bindSelector((Compilation *)this,pEVar9,*ppEVar10,(ASTContext *)withClause);
    }
    else {
      bVar7 = Type::isVirtualInterface((pEVar9->type).ptr);
      if (bVar7) {
        hierRef.path._M_extent._M_extent_value = (size_t)local_248;
        hierRef.target = (Symbol *)0x0;
        hierRef.expr._0_5_ = 0;
        hierRef.expr._5_3_ = 0;
        hierRef.path._M_ptr._0_5_ = 0;
        hierRef.upwardCount = 0;
        local_188 = local_170;
        local_180 = (BumpAllocator *)0x0;
        local_178 = (FreeNode *)0x2;
        local_130 = local_118;
        local_128 = (Type *)0x0;
        local_120 = (Type *)0x2;
        selectors._M_extent._M_extent_value = *(long *)&(comp->options).maxConstexprDepth - uVar12;
        selectors._M_ptr = (pointer)(lVar14 + *(long *)&(comp->options).maxCheckerInstanceDepth);
        Lookup::selectChild((pEVar9->type).ptr,pEVar9->sourceRange,selectors,
                            (ASTContext *)withClause,(LookupResult *)&hierRef);
        LookupResult::reportDiags((LookupResult *)&hierRef,(ASTContext *)withClause);
        if (hierRef.target == (Symbol *)0x0) {
          pEVar9 = badExpr((Compilation *)this,pEVar9);
        }
        else {
          sourceRange_03.endLoc = (SourceLocation)invocation_local;
          sourceRange_03.startLoc = sourceRange_local.endLoc;
          pEVar9 = bindLookupResult(this,(Compilation *)&hierRef,
                                    (LookupResult *)sourceRange_local.startLoc,sourceRange_03,
                                    (InvocationExpressionSyntax *)withClause_local,withClause,
                                    (ASTContext *)
                                    CONCAT71(in_stack_fffffffffffffd21,in_stack_fffffffffffffd20));
        }
        LookupResult::~LookupResult((LookupResult *)&hierRef);
        return pEVar9;
      }
      if (uVar12 == *(long *)&(comp->options).maxConstexprDepth - 1U) {
        pEVar9 = MemberAccessExpression::fromSelector
                           ((Compilation *)this,pEVar9,selector,invocation_local,withClause_local,
                            (ASTContext *)withClause,true);
        if (pEVar9->kind == Call) {
          invocation_local = (InvocationExpressionSyntax *)0x0;
          withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)0x0;
        }
      }
      else {
        pEVar9 = MemberAccessExpression::fromSelector
                           ((Compilation *)this,pEVar9,selector,(InvocationExpressionSyntax *)0x0,
                            (ArrayOrRandomizeMethodExpressionSyntax *)0x0,(ASTContext *)withClause,
                            true);
      }
    }
    lVar14 = lVar14 + 0x30;
  }
  bVar7 = bad(pEVar9);
  if (bVar7) {
    return pEVar9;
  }
  bVar7 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()(&errorIfInvoke);
  if (bVar7) {
    return pEVar9;
  }
LAB_003592f7:
  pEVar9 = badExpr((Compilation *)this,pEVar9);
  return pEVar9;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& comp, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(comp, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(comp, result, sourceRange, context);
        auto expr = comp.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(comp, expr);

        return *expr;
    }

    // If we've found a function's return value variable and have parentheses for
    // a call expression, translate that symbol to be the subroutine itself to
    // allow for recursive function calls.
    if (symbol->kind == SymbolKind::Variable && result.selectors.empty() &&
        symbol->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {

        auto scope = symbol->getParentScope();
        if (scope && (invocation || (context.flags.has(ASTFlags::TopLevelStatement) &&
                                     comp.hasFlag(CompilationFlags::AllowRecursiveImplicitCall)))) {
            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::Subroutine &&
                sym.as<SubroutineSymbol>().returnValVar == symbol) {
                SLANG_ASSERT(sym.as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function);
                symbol = &sym;
            }
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            SLANG_ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(comp, &symbol->as<SubroutineSymbol>(), nullptr,
                                               invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl &&
                result.flags.has(LookupResultFlags::IsHierarchical)) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            const bool constraintAllowed = !result.selectors.empty();
            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    constraintAllowed);
            break;
        }
        default: {
            const bool isDottedAccess =
                context.flags.has(ASTFlags::LValue) && !result.selectors.empty() &&
                std::get_if<LookupResult::MemberSelector>(&result.selectors[0]) != nullptr;

            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    /* constraintAllowed */ false, isDottedAccess);
            break;
        }
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                std::span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(comp, expr);

                return bindLookupResult(comp, nextResult, sourceRange, invocation, withClause,
                                        context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, invocation,
                                                             withClause, context,
                                                             /* isFromLookupChain */ true);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, nullptr,
                                                             nullptr, context,
                                                             /* isFromLookupChain */ true);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(comp, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(comp, expr);

    return *expr;
}